

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O1

ctmbstr getNextInstalledLanguage(TidyIterator *iter)

{
  ulong uVar1;
  ctmbstr ptVar2;
  TidyIterator p_Var3;
  TidyIterator p_Var4;
  
  if (iter == (TidyIterator *)0x0) {
    __assert_fail("iter != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/lovasoa[P]tidy-html5/src/language.c"
                  ,0x37e,"ctmbstr getNextInstalledLanguage(TidyIterator *)");
  }
  p_Var3 = *iter;
  if (p_Var3 == (TidyIterator)0x0) {
    ptVar2 = (ctmbstr)0x0;
    p_Var3 = (TidyIterator)0x0;
  }
  else {
    if ((prvTidytidyInstalledLanguageListSize::array_size == 0) &&
       (uVar1 = 0, PTR_language_en_0017e1f8 != (undefined *)0x0)) {
      do {
        prvTidytidyInstalledLanguageListSize::array_size = (int)uVar1 + 1;
        uVar1 = (ulong)prvTidytidyInstalledLanguageListSize::array_size;
      } while ((&PTR_language_en_0017e1f8)[uVar1] != (undefined *)0x0);
    }
    if ((TidyIterator)(ulong)prvTidytidyInstalledLanguageListSize::array_size < p_Var3) {
      ptVar2 = (ctmbstr)0x0;
    }
    else {
      ptVar2 = (&tidyLanguages.fallbackLanguage)[(long)p_Var3]->messages[0].value;
      p_Var3 = (TidyIterator)((long)&p_Var3->_opaque + 1);
    }
  }
  if ((prvTidytidyInstalledLanguageListSize::array_size == 0) &&
     (uVar1 = 0, PTR_language_en_0017e1f8 != (undefined *)0x0)) {
    do {
      prvTidytidyInstalledLanguageListSize::array_size = (int)uVar1 + 1;
      uVar1 = (ulong)prvTidytidyInstalledLanguageListSize::array_size;
    } while ((&PTR_language_en_0017e1f8)[uVar1] != (undefined *)0x0);
  }
  p_Var4 = (TidyIterator)0x0;
  if (p_Var3 <= (TidyIterator)(ulong)prvTidytidyInstalledLanguageListSize::array_size) {
    p_Var4 = p_Var3;
  }
  *iter = p_Var4;
  return ptVar2;
}

Assistant:

ctmbstr getNextInstalledLanguage( TidyIterator* iter )
{
    ctmbstr item = NULL;
    size_t itemIndex;
    assert( iter != NULL );
    
    itemIndex = (size_t)*iter;
    
    if ( itemIndex > 0 && itemIndex <= TY_(tidyInstalledLanguageListSize)() )
    {
        item = tidyLanguages.languages[itemIndex - 1]->messages[0].value;
        itemIndex++;
    }
    
    *iter = (TidyIterator)( itemIndex <= TY_(tidyInstalledLanguageListSize)() ? itemIndex : (size_t)0 );
    return item;
}